

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLEventsSourceTests.cpp
# Opt level: O0

void __thiscall
solitaire::events::SDLEventsSourceTests_returnMouseLeftButtonUpEvent_Test::
~SDLEventsSourceTests_returnMouseLeftButtonUpEvent_Test
          (SDLEventsSourceTests_returnMouseLeftButtonUpEvent_Test *this)

{
  SDLEventsSourceTests_returnMouseLeftButtonUpEvent_Test *this_local;
  
  ~SDLEventsSourceTests_returnMouseLeftButtonUpEvent_Test(this);
  operator_delete(this,0x70);
  return;
}

Assistant:

TEST_F(SDLEventsSourceTests, returnMouseLeftButtonUpEvent) {
    EXPECT_CALL(*sdlMock, pollEvent(_)).WillOnce(Invoke([](auto& event) {
        event.type = SDL_MOUSEBUTTONUP;
        event.button.button = SDL_BUTTON_LEFT;
        event.button.x = x;
        event.button.y = y;
        return 1;
    }));

    EXPECT_EQ(std::get<MouseLeftButtonUp>(eventsSource.getEvent()), MouseLeftButtonUp {});
}